

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_substring_rangeBeyondBounds_fn(int _i)

{
  AString string_00;
  int iVar1;
  AString *pAVar2;
  char *in_stack_fffffffffffffca0;
  uintmax_t _ck_y_23;
  uintmax_t _ck_x_35;
  char *_ck_y_q_7;
  char *_ck_x_q_7;
  char *_ck_y_s_7;
  char *_ck_x_s_7;
  char *_ck_y_22;
  char *_ck_x_34;
  void *_ck_x_33;
  uintmax_t _ck_y_21;
  uintmax_t _ck_x_32;
  uintmax_t _ck_y_20;
  uintmax_t _ck_x_31;
  char *_ck_y_q_6;
  char *_ck_x_q_6;
  char *_ck_y_s_6;
  char *_ck_x_s_6;
  char *_ck_y_19;
  char *_ck_x_30;
  void *_ck_x_29;
  uintmax_t _ck_y_18;
  uintmax_t _ck_x_28;
  void *_ck_x_27;
  uintmax_t _ck_y_17;
  uintmax_t _ck_x_26;
  char *_ck_y_q_5;
  char *_ck_x_q_5;
  char *_ck_y_s_5;
  char *_ck_x_s_5;
  char *_ck_y_16;
  char *_ck_x_25;
  void *_ck_x_24;
  uintmax_t _ck_y_15;
  uintmax_t _ck_x_23;
  uintmax_t _ck_y_14;
  uintmax_t _ck_x_22;
  char *_ck_y_q_4;
  char *_ck_x_q_4;
  char *_ck_y_s_4;
  char *_ck_x_s_4;
  char *_ck_y_13;
  char *_ck_x_21;
  void *_ck_x_20;
  uintmax_t _ck_y_12;
  uintmax_t _ck_x_19;
  void *_ck_x_18;
  uintmax_t _ck_y_11;
  uintmax_t _ck_x_17;
  char *_ck_y_q_3;
  char *_ck_x_q_3;
  char *_ck_y_s_3;
  char *_ck_x_s_3;
  char *_ck_y_10;
  char *_ck_x_16;
  void *_ck_x_15;
  uintmax_t _ck_y_9;
  uintmax_t _ck_x_14;
  uintmax_t _ck_y_8;
  uintmax_t _ck_x_13;
  char *_ck_y_q_2;
  char *_ck_x_q_2;
  char *_ck_y_s_2;
  char *_ck_x_s_2;
  char *_ck_y_7;
  char *_ck_x_12;
  void *_ck_x_11;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_10;
  void *_ck_x_9;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_8;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_4;
  char *_ck_x_7;
  void *_ck_x_6;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_5;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_4;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_3;
  void *_ck_x_2;
  uintmax_t _ck_y;
  uintmax_t _ck_x_1;
  void *_ck_x;
  AString *substring;
  AString string;
  int _i_local;
  
  string.buffer._4_4_ = _i;
  private_ACUtilsTest_AString_constructTestString((AString *)&substring,"abcd01234567wxyz",0x10);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  pAVar2 = AString_substring((AString *)&substring,0,0x11);
  if (pAVar2 == (AString *)0x0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a1,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) substring != NULL",
                      "(void*) substring",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9a1);
  if (pAVar2->capacity != 0x10) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a2,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "(*substring).capacity == (16)","(*substring).capacity",pAVar2->capacity,
                      "(16)",0x10,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9a2);
  if (pAVar2->buffer == (char *)0x0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a2,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (*substring).buffer != NULL",
                      "(void*) (*substring).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9a2);
  _ck_y_s = pAVar2->buffer;
  if (_ck_y_s == (char *)0x0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar1 = strcmp("abcd01234567wxyz",_ck_y_s);
    if (iVar1 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9a2);
      if (pAVar2->size != 0x10) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9a2,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(*substring).size == strlen(\"abcd01234567wxyz\")","(*substring).size",
                          pAVar2->size,"strlen(\"abcd01234567wxyz\")",0x10,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9a2);
      if (string.size != 0x10) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9a3,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).capacity == (16)","(string).capacity",string.size,"(16)",0x10,0)
        ;
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9a3);
      if (string.capacity == 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9a3,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                          "(void*) (string).buffer",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9a3);
      _ck_y_s_1 = (char *)string.capacity;
      if (string.capacity == 0) {
        _ck_y_q_1 = "";
        _ck_y_s_1 = "(null)";
      }
      else {
        _ck_y_q_1 = "\"";
        iVar1 = strcmp("abcd01234567wxyz",(char *)string.capacity);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a3);
          if (string.deallocator != (ACUtilsDeallocator)0x10) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9a3,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(string).size == strlen(\"abcd01234567wxyz\")","(string).size",
                              string.deallocator,"strlen(\"abcd01234567wxyz\")",0x10,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a3);
          AString_destruct(pAVar2);
          pAVar2 = AString_substring((AString *)&substring,0,0xffffffffffffffff);
          if (pAVar2 == (AString *)0x0) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9a6,"Assertion \'_ck_x != NULL\' failed",
                              "Assertion \'%s\' failed: %s == %#x","(void*) substring != NULL",
                              "(void*) substring",0,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a6);
          if (pAVar2->capacity != 0x10) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9a7,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(*substring).capacity == (16)","(*substring).capacity",
                              pAVar2->capacity,"(16)",0x10,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a7);
          if (pAVar2->buffer == (char *)0x0) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9a7,"Assertion \'_ck_x != NULL\' failed",
                              "Assertion \'%s\' failed: %s == %#x",
                              "(void*) (*substring).buffer != NULL","(void*) (*substring).buffer",0,
                              0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a7);
          _ck_y_s_2 = pAVar2->buffer;
          if (_ck_y_s_2 == (char *)0x0) {
            _ck_y_q_2 = "";
            _ck_y_s_2 = "(null)";
          }
          else {
            _ck_y_q_2 = "\"";
            iVar1 = strcmp("abcd01234567wxyz",_ck_y_s_2);
            if (iVar1 == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9a7);
              if (pAVar2->size != 0x10) {
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9a7,"Assertion \'_ck_x == _ck_y\' failed",
                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                  "(*substring).size == strlen(\"abcd01234567wxyz\")",
                                  "(*substring).size",pAVar2->size,"strlen(\"abcd01234567wxyz\")",
                                  0x10,0);
              }
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9a7);
              if (string.size != 0x10) {
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9a8,"Assertion \'_ck_x == _ck_y\' failed",
                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                  "(string).capacity == (16)","(string).capacity",string.size,"(16)"
                                  ,0x10,0);
              }
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9a8);
              if (string.capacity == 0) {
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9a8,"Assertion \'_ck_x != NULL\' failed",
                                  "Assertion \'%s\' failed: %s == %#x",
                                  "(void*) (string).buffer != NULL","(void*) (string).buffer",0,0);
              }
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9a8);
              _ck_y_s_3 = (char *)string.capacity;
              if (string.capacity == 0) {
                _ck_y_q_3 = "";
                _ck_y_s_3 = "(null)";
              }
              else {
                _ck_y_q_3 = "\"";
                iVar1 = strcmp("abcd01234567wxyz",(char *)string.capacity);
                if (iVar1 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9a8);
                  if (string.deallocator != (ACUtilsDeallocator)0x10) {
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9a8,"Assertion \'_ck_x == _ck_y\' failed",
                                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                      "(string).size == strlen(\"abcd01234567wxyz\")",
                                      "(string).size",string.deallocator,
                                      "strlen(\"abcd01234567wxyz\")",0x10,0);
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9a8);
                  AString_destruct(pAVar2);
                  pAVar2 = AString_substring((AString *)&substring,8,0xffffffffffffffff);
                  if (pAVar2 == (AString *)0x0) {
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9ab,"Assertion \'_ck_x != NULL\' failed",
                                      "Assertion \'%s\' failed: %s == %#x",
                                      "(void*) substring != NULL","(void*) substring",0,0);
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9ab);
                  if (pAVar2->capacity != 8) {
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9ac,"Assertion \'_ck_x == _ck_y\' failed",
                                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                      "(*substring).capacity == (8)","(*substring).capacity",
                                      pAVar2->capacity,"(8)",8,0);
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9ac);
                  if (pAVar2->buffer == (char *)0x0) {
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9ac,"Assertion \'_ck_x != NULL\' failed",
                                      "Assertion \'%s\' failed: %s == %#x",
                                      "(void*) (*substring).buffer != NULL",
                                      "(void*) (*substring).buffer",0,0);
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9ac);
                  _ck_y_s_4 = pAVar2->buffer;
                  if (_ck_y_s_4 == (char *)0x0) {
                    _ck_y_q_4 = "";
                    _ck_y_s_4 = "(null)";
                  }
                  else {
                    _ck_y_q_4 = "\"";
                    iVar1 = strcmp("4567wxyz",_ck_y_s_4);
                    if (iVar1 == 0) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9ac);
                      if (pAVar2->size != 8) {
                        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x9ac,"Assertion \'_ck_x == _ck_y\' failed",
                                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                          "(*substring).size == strlen(\"4567wxyz\")",
                                          "(*substring).size",pAVar2->size,"strlen(\"4567wxyz\")",8,
                                          0);
                      }
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9ac);
                      if (string.size != 0x10) {
                        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x9ad,"Assertion \'_ck_x == _ck_y\' failed",
                                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                          "(string).capacity == (16)","(string).capacity",
                                          string.size,"(16)",0x10,0);
                      }
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9ad);
                      if (string.capacity == 0) {
                        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x9ad,"Assertion \'_ck_x != NULL\' failed",
                                          "Assertion \'%s\' failed: %s == %#x",
                                          "(void*) (string).buffer != NULL",
                                          "(void*) (string).buffer",0,0);
                      }
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9ad);
                      _ck_y_s_5 = (char *)string.capacity;
                      if (string.capacity == 0) {
                        _ck_y_q_5 = "";
                        _ck_y_s_5 = "(null)";
                      }
                      else {
                        _ck_y_q_5 = "\"";
                        iVar1 = strcmp("abcd01234567wxyz",(char *)string.capacity);
                        if (iVar1 == 0) {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9ad);
                          if (string.deallocator != (ACUtilsDeallocator)0x10) {
                            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x9ad,"Assertion \'_ck_x == _ck_y\' failed",
                                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                              "(string).size == strlen(\"abcd01234567wxyz\")",
                                              "(string).size",string.deallocator,
                                              "strlen(\"abcd01234567wxyz\")",0x10,0);
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9ad);
                          AString_destruct(pAVar2);
                          pAVar2 = AString_substring((AString *)&substring,0xf,0x29a);
                          if (pAVar2 == (AString *)0x0) {
                            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x9b0,"Assertion \'_ck_x != NULL\' failed",
                                              "Assertion \'%s\' failed: %s == %#x",
                                              "(void*) substring != NULL","(void*) substring",0,0);
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9b0);
                          if (pAVar2->capacity != 8) {
                            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x9b1,"Assertion \'_ck_x == _ck_y\' failed",
                                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                              "(*substring).capacity == (8)","(*substring).capacity"
                                              ,pAVar2->capacity,"(8)",8,0);
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9b1);
                          if (pAVar2->buffer != (char *)0x0) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x9b1);
                            _ck_y_s_6 = pAVar2->buffer;
                            if (_ck_y_s_6 == (char *)0x0) {
                              _ck_y_q_6 = "";
                              _ck_y_s_6 = "(null)";
                            }
                            else {
                              _ck_y_q_6 = "\"";
                              iVar1 = strcmp("z",_ck_y_s_6);
                              if (iVar1 == 0) {
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0x9b1);
                                if (pAVar2->size != 1) {
                                  _ck_assert_failed(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b1,"Assertion \'_ck_x == _ck_y\' failed",
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                                  "(*substring).size == strlen(\"z\")",
                                                  "(*substring).size",pAVar2->size,"strlen(\"z\")",1
                                                  ,0);
                                }
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0x9b1);
                                if (string.size == 0x10) {
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x9b2);
                                  if (string.capacity == 0) {
                                    _ck_assert_failed(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b2,"Assertion \'_ck_x != NULL\' failed",
                                                  "Assertion \'%s\' failed: %s == %#x",
                                                  "(void*) (string).buffer != NULL",
                                                  "(void*) (string).buffer",0,0);
                                  }
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x9b2);
                                  _ck_y_s_7 = (char *)string.capacity;
                                  if (string.capacity == 0) {
                                    _ck_y_q_7 = "";
                                    _ck_y_s_7 = "(null)";
                                  }
                                  else {
                                    _ck_y_q_7 = "\"";
                                    iVar1 = strcmp("abcd01234567wxyz",(char *)string.capacity);
                                    if (iVar1 == 0) {
                                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b2);
                                      if (string.deallocator == (ACUtilsDeallocator)0x10) {
                                        _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b2);
                                        AString_destruct(pAVar2);
                                        string_00.deallocator = string.deallocator;
                                        string_00.reallocator = string.reallocator;
                                        string_00.size = string.size;
                                        string_00.capacity = string.capacity;
                                        string_00.buffer = in_stack_fffffffffffffca0;
                                        private_ACUtilsTest_AString_destructTestString(string_00);
                                        return;
                                      }
                                      _ck_assert_failed(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b2,"Assertion \'_ck_x == _ck_y\' failed",
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                                  "(string).size == strlen(\"abcd01234567wxyz\")",
                                                  "(string).size",string.deallocator,
                                                  "strlen(\"abcd01234567wxyz\")",0x10,0);
                                    }
                                  }
                                  _ck_assert_failed(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b2,
                                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                                  ,
                                                  "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                                  ,"(string).buffer == (\"abcd01234567wxyz\")",
                                                  "(string).buffer",_ck_y_q_7,_ck_y_s_7,_ck_y_q_7,
                                                  "(\"abcd01234567wxyz\")","\"","abcd01234567wxyz",
                                                  "\"",0);
                                }
                                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b2,"Assertion \'_ck_x == _ck_y\' failed",
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                                  "(string).capacity == (16)","(string).capacity",
                                                  string.size,"(16)",0x10,0);
                              }
                            }
                            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x9b1,
                                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                              ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                              ,"(*substring).buffer == (\"z\")",
                                              "(*substring).buffer",_ck_y_q_6,_ck_y_s_6,_ck_y_q_6,
                                              "(\"z\")","\"","z","\"",0);
                          }
                          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0x9b1,"Assertion \'_ck_x != NULL\' failed",
                                            "Assertion \'%s\' failed: %s == %#x",
                                            "(void*) (*substring).buffer != NULL",
                                            "(void*) (*substring).buffer",0,0);
                        }
                      }
                      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x9ad,
                                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                        "(string).buffer == (\"abcd01234567wxyz\")",
                                        "(string).buffer",_ck_y_q_5,_ck_y_s_5,_ck_y_q_5,
                                        "(\"abcd01234567wxyz\")","\"","abcd01234567wxyz","\"",0);
                    }
                  }
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0x9ac,
                                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                    "(*substring).buffer == (\"4567wxyz\")","(*substring).buffer",
                                    _ck_y_q_4,_ck_y_s_4,_ck_y_q_4,"(\"4567wxyz\")","\"","4567wxyz",
                                    "\"",0);
                }
              }
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x9a8,
                                "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                "(string).buffer == (\"abcd01234567wxyz\")","(string).buffer",
                                _ck_y_q_3,_ck_y_s_3,_ck_y_q_3,"(\"abcd01234567wxyz\")","\"",
                                "abcd01234567wxyz","\"",0);
            }
          }
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x9a7,
                            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                            ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                            "(*substring).buffer == (\"abcd01234567wxyz\")","(*substring).buffer",
                            _ck_y_q_2,_ck_y_s_2,_ck_y_q_2,"(\"abcd01234567wxyz\")","\"",
                            "abcd01234567wxyz","\"",0);
        }
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9a3,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(string).buffer == (\"abcd01234567wxyz\")","(string).buffer",_ck_y_q_1,
                        _ck_y_s_1,_ck_y_q_1,"(\"abcd01234567wxyz\")","\"","abcd01234567wxyz","\"",0)
      ;
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9a2,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(*substring).buffer == (\"abcd01234567wxyz\")","(*substring).buffer",_ck_y_q,
                    _ck_y_s,_ck_y_q,"(\"abcd01234567wxyz\")","\"","abcd01234567wxyz","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_substring_rangeBeyondBounds)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("abcd01234567wxyz", 16);
    struct AString *substring;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    substring = AString_substring(&string, 0, 17);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "abcd01234567wxyz", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, 0, -1);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "abcd01234567wxyz", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, 8, -1);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "4567wxyz", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, 15, 666);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "z", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    private_ACUtilsTest_AString_destructTestString(string);
}